

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O0

bool cmGetTestPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmValue this;
  cmExecutionStatus *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference name;
  cmMakefile *this_01;
  ulong uVar4;
  char *__str;
  string_view local_a8;
  string_view local_98;
  string *local_88;
  cmValue local_80;
  cmValue prop;
  cmTest *test;
  cmMakefile *mf;
  string *var;
  string *testName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this_00 = local_20;
  if (sVar2 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,2);
    this_01 = cmExecutionStatus::GetMakefile(local_20);
    prop.Value = (string *)cmMakefile::GetTest(this_01,pvVar3);
    if ((cmTest *)prop.Value != (cmTest *)0x0) {
      cmValue::cmValue(&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,1);
      uVar4 = std::__cxx11::string::empty();
      this = prop;
      if ((uVar4 & 1) == 0) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,1);
        local_88 = (string *)cmTest::GetProperty(this.Value,pvVar3);
        local_80 = (cmValue)local_88;
      }
      bVar1 = cmValue::operator_cast_to_bool(&local_80);
      if (bVar1) {
        cmValue::operator->[abi_cxx11_(&local_80);
        __str = (char *)std::__cxx11::string::c_str();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,__str);
        cmMakefile::AddDefinition(this_01,name,local_98);
        return true;
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"NOTFOUND");
    cmMakefile::AddDefinition(this_01,name,local_a8);
    args_local._7_1_ = true;
  }
  return args_local._7_1_;
}

Assistant:

bool cmGetTestPropertyCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& testName = args[0];
  std::string const& var = args[2];
  cmMakefile& mf = status.GetMakefile();
  cmTest* test = mf.GetTest(testName);
  if (test) {
    cmValue prop;
    if (!args[1].empty()) {
      prop = test->GetProperty(args[1]);
    }
    if (prop) {
      mf.AddDefinition(var, prop->c_str());
      return true;
    }
  }
  mf.AddDefinition(var, "NOTFOUND");
  return true;
}